

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBlock * ParseBlock(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  Lexeme *pLVar2;
  IntrusiveList<SynBase> expressions_00;
  IntrusiveList<SynBase> expressions;
  uint blockLimit;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_ofigure);
  if (bVar1) {
    if (0xff < ctx->statementBlockDepth) {
      pLVar2 = ParseContext::Current(ctx);
      anon_unknown.dwarf_104b6::Stop(ctx,pLVar2,"ERROR: reached nested \'{\' limit of %d",0x100);
    }
    ctx->statementBlockDepth = ctx->statementBlockDepth + 1;
    expressions_00 = ParseExpressions(ctx);
    ctx->statementBlockDepth = ctx->statementBlockDepth - 1;
    anon_unknown.dwarf_104b6::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
    ctx_local = (ParseContext *)ParseContext::get<SynBlock>(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    SynBlock::SynBlock((SynBlock *)ctx_local,begin,pLVar2,expressions_00);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynBlock *)ctx_local;
}

Assistant:

SynBlock* ParseBlock(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_ofigure))
	{
		const unsigned blockLimit = 256;

		if(ctx.statementBlockDepth >= blockLimit)
			Stop(ctx, ctx.Current(), "ERROR: reached nested '{' limit of %d", blockLimit);

		ctx.statementBlockDepth++;

		IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

		ctx.statementBlockDepth--;

		CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");

		return new (ctx.get<SynBlock>()) SynBlock(start, ctx.Previous(), expressions);
	}

	return NULL;
}